

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O0

int http_parser_parse_url_(char *buf,size_t buflen,int is_connect,http_parser_url *u)

{
  int iVar1;
  ulong uVar2;
  unsigned_long v;
  int local_48;
  int found_at;
  http_parser_url_fields old_uf;
  http_parser_url_fields uf;
  char *p;
  state s;
  http_parser_url *u_local;
  int is_connect_local;
  size_t buflen_local;
  char *buf_local;
  
  v._4_4_ = 0;
  u->field_set = 0;
  u->port = 0;
  p._4_4_ = s_req_spaces_before_url;
  if (is_connect != 0) {
    p._4_4_ = s_req_server_start;
  }
  local_48 = 7;
  _old_uf = buf;
  do {
    if (buf + buflen <= _old_uf) {
      if (((u->field_set & 3) == 0) || (iVar1 = http_parse_host_(buf,u,v._4_4_), iVar1 == 0)) {
        if ((is_connect == 0) || (u->field_set == 6)) {
          if ((u->field_set & 4) != 0) {
            uVar2 = strtoul(buf + (int)(uint)u->field_data[2].off,(char **)0x0,10);
            if (0xffff < uVar2) {
              return 1;
            }
            u->port = (uint16_t)uVar2;
          }
          buf_local._4_4_ = 0;
        }
        else {
          buf_local._4_4_ = 1;
        }
      }
      else {
        buf_local._4_4_ = 1;
      }
      return buf_local._4_4_;
    }
    p._4_4_ = parse_url_char_(p._4_4_,*_old_uf);
    switch(p._4_4_) {
    case s_dead:
      return 1;
    default:
      __assert_fail("!\"Unexpected state\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/http_parser/http_parser.c"
                    ,0x84a,
                    "int http_parser_parse_url_(const char *, size_t, int, struct http_parser_url *)"
                   );
    case s_req_schema:
      found_at = 0;
      break;
    case s_req_schema_slash:
    case s_req_schema_slash_slash:
    case s_req_server_start:
    case s_req_query_string_start:
    case s_req_fragment_start:
      goto LAB_001b6faf;
    case s_req_server_with_at:
      v._4_4_ = 1;
    case s_req_server:
      found_at = 1;
      break;
    case s_req_path:
      found_at = 3;
      break;
    case s_req_query_string:
      found_at = 4;
      break;
    case s_req_fragment:
      found_at = 5;
    }
    if (found_at == local_48) {
      u->field_data[(uint)found_at].len = u->field_data[(uint)found_at].len + 1;
    }
    else {
      u->field_data[(uint)found_at].off = (short)_old_uf - (short)buf;
      u->field_data[(uint)found_at].len = 1;
      u->field_set = u->field_set | (ushort)(1 << (sbyte)found_at);
      local_48 = found_at;
    }
LAB_001b6faf:
    _old_uf = _old_uf + 1;
  } while( true );
}

Assistant:

int
http_parser_parse_url_(const char *buf, size_t buflen, int is_connect,
                      struct http_parser_url *u)
{
  enum state s;
  const char *p;
  enum http_parser_url_fields uf, old_uf;
  int found_at = 0;

  u->port = u->field_set = 0;
  s = is_connect ? s_req_server_start : s_req_spaces_before_url;
  uf = old_uf = UF_MAX;

  for (p = buf; p < buf + buflen; p++) {
    s = parse_url_char_(s, *p);

    /* Figure out the next field that we're operating on */
    switch (s) {
      case s_dead:
        return 1;

      /* Skip delimeters */
      case s_req_schema_slash:
      case s_req_schema_slash_slash:
      case s_req_server_start:
      case s_req_query_string_start:
      case s_req_fragment_start:
        continue;

      case s_req_schema:
        uf = UF_SCHEMA;
        break;

      case s_req_server_with_at:
        found_at = 1;

      /* FALLTROUGH */
      case s_req_server:
        uf = UF_HOST;
        break;

      case s_req_path:
        uf = UF_PATH;
        break;

      case s_req_query_string:
        uf = UF_QUERY;
        break;

      case s_req_fragment:
        uf = UF_FRAGMENT;
        break;

      default:
        assert(!"Unexpected state");
        return 1;
    }

    /* Nothing's changed; soldier on */
    if (uf == old_uf) {
      u->field_data[uf].len++;
      continue;
    }

    u->field_data[uf].off = p - buf;
    u->field_data[uf].len = 1;

    u->field_set |= (1 << uf);
    old_uf = uf;
  }

  /* host must be present if there is a schema */
  /* parsing http:///toto will fail */
  if ((u->field_set & ((1 << UF_SCHEMA) | (1 << UF_HOST))) != 0) {
    if (http_parse_host_(buf, u, found_at) != 0) {
      return 1;
    }
  }

  /* CONNECT requests can only contain "hostname:port" */
  if (is_connect && u->field_set != ((1 << UF_HOST)|(1 << UF_PORT))) {
    return 1;
  }

  if (u->field_set & (1 << UF_PORT)) {
    /* Don't bother with endp; we've already validated the string */
    unsigned long v = strtoul(buf + u->field_data[UF_PORT].off, NULL, 10);

    /* Ports have a max value of 2^16 */
    if (v > 0xffff) {
      return 1;
    }

    u->port = (uint16_t) v;
  }

  return 0;
}